

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageDrawRectangleRec(Image *dst,Rectangle rec,Color color)

{
  int y;
  int y_00;
  int iVar1;
  int x;
  int x_00;
  
  if (((dst->data != (void *)0x0) && (dst->width != 0)) && (dst->height != 0)) {
    y_00 = (int)rec.y;
    iVar1 = (int)rec.height + y_00;
    for (; x_00 = (int)rec.x, y_00 < iVar1; y_00 = y_00 + 1) {
      for (; x_00 < (int)rec.width + (int)rec.x; x_00 = x_00 + 1) {
        ImageDrawPixel(dst,x_00,y_00,color);
      }
    }
  }
  return;
}

Assistant:

void ImageDrawRectangleRec(Image *dst, Rectangle rec, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0)) return;

    int sy = (int)rec.y;
    int ey = sy + (int)rec.height;

    int sx = (int)rec.x;
    int ex = sx + (int)rec.width;

    for (int y = sy; y < ey; y++)
    {
        for (int x = sx; x < ex; x++)
        {
            ImageDrawPixel(dst, x, y, color);
        }
    }
}